

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O3

int archive_write_shar_close(archive_write *a)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  
  pvVar1 = a->format_data;
  iVar3 = 0;
  if (*(int *)((long)pvVar1 + 0x58) != 0) {
    archive_strcat((archive_string *)((long)pvVar1 + 0x60),"exit\n");
    iVar2 = __archive_write_output
                      (a,*(void **)((long)pvVar1 + 0x60),*(size_t *)((long)pvVar1 + 0x68));
    iVar3 = -0x1e;
    if (iVar2 == 0) {
      archive_write_set_bytes_in_last_block(&a->archive,1);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
archive_write_shar_close(struct archive_write *a)
{
	struct shar *shar;
	int ret;

	/*
	 * TODO: Accumulate list of directory names/modes and
	 * fix them all up at end-of-archive.
	 */

	shar = (struct shar *)a->format_data;

	/*
	 * Only write the end-of-archive markers if the archive was
	 * actually started.  This avoids problems if someone sets
	 * shar format, then sets another format (which would invoke
	 * shar_finish to free the format-specific data).
	 */
	if (shar->wrote_header == 0)
		return (ARCHIVE_OK);

	archive_strcat(&shar->work, "exit\n");

	ret = __archive_write_output(a, shar->work.s, shar->work.length);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Shar output is never padded. */
	archive_write_set_bytes_in_last_block(&a->archive, 1);
	/*
	 * TODO: shar should also suppress padding of
	 * uncompressed data within gzip/bzip2 streams.
	 */

	return (ARCHIVE_OK);
}